

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O0

uint32_t nivalis::OpCode::from_char(char opchar)

{
  char opchar_local;
  uint32_t local_4;
  
  switch(opchar) {
  case '%':
    local_4 = 0x32;
    break;
  case '&':
    local_4 = 0x52;
    break;
  default:
    local_4 = 0x18;
    break;
  case '*':
    local_4 = 0x30;
    break;
  case '+':
    local_4 = 0x20;
    break;
  case '-':
    local_4 = 0x21;
    break;
  case '/':
    local_4 = 0x31;
    break;
  case '<':
    local_4 = 0x60;
    break;
  case '=':
    local_4 = 0x62;
    break;
  case '>':
    local_4 = 0x65;
    break;
  case '^':
    local_4 = 0x40;
    break;
  case '|':
    local_4 = 0x53;
  }
  return local_4;
}

Assistant:

uint32_t from_char(char opchar) {
    switch (opchar) {
        case '+': return OpCode::add;
        case '-': return OpCode::sub;
        case '*': return OpCode::mul;
        case '/': return OpCode::divi;
        case '%': return OpCode::mod;
        case '^': return OpCode::power;
        case '<': return OpCode::lt;
        case '>': return OpCode::gt;
        case '=': return OpCode::eq;
        case '&': return OpCode::land;
        case '|': return OpCode::lor;
        default: return OpCode::bsel;
    };
}